

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# access.c
# Opt level: O0

int ctox(tmbchar ch)

{
  undefined4 local_c;
  tmbchar ch_local;
  
  if ((ch < '0') || ('9' < ch)) {
    if ((ch < 'a') || ('f' < ch)) {
      if ((ch < 'A') || ('F' < ch)) {
        local_c = -1;
      }
      else {
        local_c = ch + -0x37;
      }
    }
    else {
      local_c = ch + -0x57;
    }
  }
  else {
    local_c = ch + -0x30;
  }
  return local_c;
}

Assistant:

static int ctox( tmbchar ch )
{
    if ( ch >= '0' && ch <= '9' )
    {
         return ch - '0';
    }
    else if ( ch >= 'a' && ch <= 'f' )
    {
        return ch - 'a' + 10;
    }
    else if ( ch >= 'A' && ch <= 'F' )
    {
        return ch - 'A' + 10;
    }
    return -1;
}